

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_extra.c
# Opt level: O2

void jp2_write_colr(opj_jp2_t *jp2,opj_cio_t *cio)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar3 = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x636f6c72,4);
  jp2->meth = 1;
  jp2->approx = 0;
  jp2->precedence = 0;
  cio_write(cio,1,1);
  cio_write(cio,(ulong)jp2->precedence,1);
  cio_write(cio,(ulong)jp2->approx,1);
  jp2->enumcs = 0x10;
  cio_write(cio,0x10,4);
  iVar4 = cio_tell(cio);
  cio_seek(cio,iVar3);
  cio_write(cio,(ulong)(uint)(iVar4 - iVar3),4);
  cio_seek(cio,iVar4);
  iVar3 = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x70636c72,4);
  cio_write(cio,0x100,2);
  cio_write(cio,3,1);
  cio_write(cio,7,1);
  cio_write(cio,7,1);
  cio_write(cio,7,1);
  pvVar1 = jp2->cinfo->client_data;
  if ((pvVar1 != (void *)0x0) && (lVar2 = *(long *)((long)pvVar1 + 8), lVar2 != 0)) {
    for (lVar5 = 2; lVar5 != 0x302; lVar5 = lVar5 + 3) {
      cio_write(cio,(ulong)*(byte *)(lVar2 + -2 + lVar5),1);
      cio_write(cio,(ulong)*(byte *)(lVar2 + -1 + lVar5),1);
      cio_write(cio,(ulong)*(byte *)(lVar2 + lVar5),1);
    }
  }
  iVar4 = cio_tell(cio);
  cio_seek(cio,iVar3);
  cio_write(cio,(ulong)(uint)(iVar4 - iVar3),4);
  cio_seek(cio,iVar4);
  iVar3 = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x636d6170,4);
  cio_write(cio,0,2);
  cio_write(cio,1,1);
  cio_write(cio,0,1);
  cio_write(cio,0,2);
  cio_write(cio,1,1);
  cio_write(cio,1,1);
  cio_write(cio,0,2);
  cio_write(cio,1,1);
  cio_write(cio,2,1);
  iVar4 = cio_tell(cio);
  cio_seek(cio,iVar3);
  cio_write(cio,(ulong)(uint)(iVar4 - iVar3),4);
  cio_seek(cio,iVar4);
  return;
}

Assistant:

void jp2_write_colr(opj_jp2_t * jp2, opj_cio_t * cio)
{
    jp2_write_colr_real(jp2, cio);
    jp2_write_pclr(jp2, cio);
    jp2_write_cmap(jp2, cio);
}